

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void BezierClosestPointCasteljauStep
               (ImVec2 *p,ImVec2 *p_closest,ImVec2 *p_last,float *p_closest_dist2,float x1,float y1,
               float x2,float y2,float x3,float y3,float x4,float y4,float tess_tol,int level)

{
  uint uVar1;
  uint uVar2;
  float in_XMM0_Db;
  ImVec2 IVar3;
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float in_XMM4_Db;
  float fVar4;
  float in_XMM5_Db;
  float fVar5;
  float in_XMM6_Db;
  float in_XMM7_Db;
  float fVar6;
  float fVar7;
  ImVec2 local_d0;
  float local_c8;
  float fStack_c4;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_c8 = x4;
  fStack_c4 = in_XMM6_Db;
  local_b8 = y4;
  fStack_b4 = in_XMM7_Db;
  local_a8 = y4;
  fStack_a4 = y4;
  fStack_a0 = y4;
  fStack_9c = y4;
  local_98 = x4;
  fStack_94 = x4;
  fStack_90 = x4;
  fStack_8c = x4;
  while( true ) {
    fVar6 = local_c8 - x1;
    fVar7 = local_b8 - y1;
    fVar4 = fVar7 * (x2 - local_98) - fVar6 * (y2 - local_a8);
    fVar5 = fVar7 * (x3 - fStack_94) - fVar6 * (y3 - fStack_a4);
    uVar1 = -(uint)(-fVar4 <= fVar4);
    uVar2 = -(uint)(-fVar5 <= fVar5);
    fVar4 = (float)(~uVar2 & (uint)-fVar5 | (uint)fVar5 & uVar2) +
            (float)(~uVar1 & (uint)-fVar4 | (uint)fVar4 & uVar1);
    if (fVar4 * fVar4 < (fVar6 * fVar6 + fVar7 * fVar7) * tess_tol) {
      local_d0.x = local_c8;
      local_d0.y = local_b8;
      IVar3 = ImLineClosestPoint(p_last,&local_d0,p);
      fVar4 = p->x - IVar3.x;
      fVar5 = p->y - IVar3.y;
      fVar4 = fVar4 * fVar4 + fVar5 * fVar5;
      if (fVar4 < *p_closest_dist2) {
        *p_closest = IVar3;
        *p_closest_dist2 = fVar4;
      }
      IVar3.y = local_d0.y;
      IVar3.x = local_d0.x;
      *p_last = IVar3;
      return;
    }
    if (9 < level) break;
    fVar4 = (x3 + x2) * 0.5;
    fVar6 = (y3 + y2) * 0.5;
    local_58 = (x2 + x1) * 0.5;
    fStack_54 = (local_c8 + x3) * 0.5;
    fStack_50 = (in_XMM2_Db + in_XMM0_Db) * 0.0;
    fStack_4c = (fStack_c4 + in_XMM4_Db) * 0.0;
    fVar5 = (fVar4 + local_58) * 0.5;
    fStack_74 = (fVar4 + fStack_54) * 0.5;
    local_68 = (y2 + y1) * 0.5;
    fStack_64 = (local_b8 + y3) * 0.5;
    fStack_60 = (in_XMM3_Db + in_XMM1_Db) * 0.0;
    fStack_5c = (fStack_b4 + in_XMM5_Db) * 0.0;
    fVar4 = (fVar6 + local_68) * 0.5;
    fStack_84 = (fVar6 + fStack_64) * 0.5;
    local_78 = (fStack_74 + fVar5) * 0.5;
    local_88 = (fStack_84 + fVar4) * 0.5;
    level = level + 1;
    fStack_80 = fStack_84;
    fStack_7c = fStack_84;
    fStack_70 = fStack_74;
    fStack_6c = fStack_74;
    local_48 = fStack_84;
    fStack_44 = fStack_84;
    fStack_40 = fStack_84;
    fStack_3c = fStack_84;
    local_38 = fStack_74;
    fStack_34 = fStack_74;
    fStack_30 = fStack_74;
    fStack_2c = fStack_74;
    BezierClosestPointCasteljauStep
              (p,p_closest,p_last,p_closest_dist2,x1,y1,local_58,local_68,fVar5,fVar4,local_78,
               local_88,tess_tol,level);
    in_XMM0_Db = fStack_50;
    in_XMM4_Db = fStack_4c;
    y1 = local_88;
    y3 = fStack_64;
    in_XMM1_Db = fStack_60;
    in_XMM5_Db = fStack_5c;
    x2 = local_38;
    in_XMM2_Db = fStack_34;
    y2 = local_48;
    in_XMM3_Db = fStack_44;
    x1 = local_78;
    x3 = fStack_54;
  }
  return;
}

Assistant:

static void BezierClosestPointCasteljauStep(const ImVec2& p, ImVec2& p_closest, ImVec2& p_last, float& p_closest_dist2, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2+d3) * (d2+d3) < tess_tol * (dx*dx + dy*dy))
    {
        ImVec2 p_current(x4, y4);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    else if (level < 10)
    {
        float x12 = (x1+x2)*0.5f,       y12 = (y1+y2)*0.5f;
        float x23 = (x2+x3)*0.5f,       y23 = (y2+y3)*0.5f;
        float x34 = (x3+x4)*0.5f,       y34 = (y3+y4)*0.5f;
        float x123 = (x12+x23)*0.5f,    y123 = (y12+y23)*0.5f;
        float x234 = (x23+x34)*0.5f,    y234 = (y23+y34)*0.5f;
        float x1234 = (x123+x234)*0.5f, y1234 = (y123+y234)*0.5f;
        BezierClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        BezierClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}